

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_portability_unit.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  undefined **ppuVar8;
  CMUnitTest *pCVar9;
  byte bVar10;
  CMUnitTest tests [2];
  
  bVar10 = 0;
  puVar2 = (uint *)cpuid_Version_info(1);
  uVar6 = (ulong)puVar2[2];
  uVar3 = *puVar2 >> 4;
  uVar1 = uVar3 - 0x2065;
  if (10 < uVar1) {
LAB_001023ea:
    switch(uVar3) {
    case 0x1066:
switchD_001025a5_caseD_1066:
      pcVar7 = "Merom";
      goto LAB_001026c5;
    case 0x1067:
    case 0x106d:
      pcVar7 = "Penryn";
      goto LAB_001026c5;
    case 0x1068:
    case 0x1069:
    case 0x106b:
    case 0x106c:
switchD_001025a5_caseD_1068:
      pcVar7 = "unknown";
      goto LAB_001026c5;
    case 0x106a:
    case 0x106e:
      goto switchD_001025a5_caseD_106a;
    default:
      if (uVar3 - 99 < 2) {
        pcVar7 = "Prescott";
        goto LAB_001026c5;
      }
      if (uVar3 - 0x806c < 2) {
        pcVar7 = "TigerLake";
        goto LAB_001026c5;
      }
      if (uVar3 - 0xa065 < 2) {
        pcVar7 = "Cometlake";
        goto LAB_001026c5;
      }
      if (uVar3 == 0x66) {
        pcVar7 = "Presler";
        goto LAB_001026c5;
      }
      if (uVar3 == 0x6d) {
        pcVar7 = "Dothan";
        goto LAB_001026c5;
      }
      if (uVar3 == 0x6f) goto switchD_001025a5_caseD_1066;
      if (uVar3 == 0x16c) {
        pcVar7 = "Pineview";
        goto LAB_001026c5;
      }
      if (uVar3 == 0x266) {
        pcVar7 = "Lincroft";
        goto LAB_001026c5;
      }
      if (uVar3 == 0x366) {
        pcVar7 = "Cedarview";
        goto LAB_001026c5;
      }
      if (uVar3 == 0x306a) {
        pcVar7 = "IvyBridge";
        goto LAB_001026c5;
      }
      if (uVar3 == 0x306c) {
        pcVar7 = "Haswell";
        goto LAB_001026c5;
      }
      if (uVar3 == 0x306d) {
        pcVar7 = "Broadwell";
        goto LAB_001026c5;
      }
      if (uVar3 == 0x30f1) goto LAB_001025b3;
      if (uVar3 == 0x60f10) {
        pcVar7 = "Zen4";
        goto LAB_001026c5;
      }
      if (uVar3 == 0x506c) {
LAB_00102613:
        pcVar7 = "Goldmont";
        goto LAB_001026c5;
      }
      if (uVar3 == 0x506e) {
        pcVar7 = "Skylake";
        goto LAB_001026c5;
      }
      if (uVar3 == 0x606a) {
LAB_0010261f:
        pcVar7 = "Icelake";
      }
      else {
        if ((uVar3 != 0x60f0) && (uVar3 != 0x60f8)) {
          if (uVar3 == 0x706a) goto LAB_00102613;
          if (uVar3 == 0x706e) goto LAB_0010261f;
          if (uVar3 != 0x70f1) {
            if (uVar3 != 0x806e) {
              if ((uVar3 == 0x9067) || (uVar3 == 0x906a)) {
                pcVar7 = "Alderlake";
                goto LAB_001026c5;
              }
              if (uVar3 != 0x906e) {
                if (uVar3 != 0x90f0) {
                  if (uVar3 == 0xa067) {
                    pcVar7 = "Rocketlake";
                    goto LAB_001026c5;
                  }
                  if (uVar3 == 0xb067) {
                    pcVar7 = "Raptorlake";
                    goto LAB_001026c5;
                  }
                  if (uVar3 != 0x20f10) {
                    if (uVar3 == 0x40f40) {
                      pcVar7 = "Zen3+";
                      goto LAB_001026c5;
                    }
                    if (uVar3 != 0x50f00) {
                      if (uVar3 == 0x406c) {
                        pcVar7 = "CherryTrail";
                        goto LAB_001026c5;
                      }
                      goto switchD_001025a5_caseD_1068;
                    }
                  }
                  pcVar7 = "Zen3";
                  goto LAB_001026c5;
                }
                goto LAB_001025b3;
              }
            }
            pcVar7 = "Kabylake";
            goto LAB_001026c5;
          }
        }
LAB_001025b3:
        pcVar7 = "Zen2";
      }
      goto LAB_001026c5;
    }
  }
  uVar6 = 0x481;
  if ((0x481U >> (uVar1 & 0x1f) & 1) != 0) {
    pcVar7 = "Westmere";
    goto LAB_001026c5;
  }
  uVar6 = 0x120;
  if ((0x120U >> (uVar1 & 0x1f) & 1) != 0) {
    pcVar7 = "SandyBridge";
    goto LAB_001026c5;
  }
  if (uVar1 != 9) goto LAB_001023ea;
switchD_001025a5_caseD_106a:
  pcVar7 = "Nehalem";
LAB_001026c5:
  printf("x64 processor:  %s\t",pcVar7,uVar6);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar5 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar5 + 0xc) != '@') {
    lVar5 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar5 + 0xc),(ulong)*(uint *)(lVar5 + 8),
           (ulong)*(uint *)(lVar5 + 0xc));
  }
  ppuVar8 = &PTR_anon_var_dwarf_27_0012fd80;
  pCVar9 = tests;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pCVar9->name = *ppuVar8;
    ppuVar8 = ppuVar8 + (ulong)bVar10 * -2 + 1;
    pCVar9 = (CMUnitTest *)((long)pCVar9 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  iVar4 = _cmocka_run_group_tests("tests",tests,2,(CMFixtureFunction)0x0,(CMFixtureFunction)0x0);
  return iVar4;
}

Assistant:

int main() {
    tellmeall();
#if CROARING_IS_BIG_ENDIAN
    printf("Big-endian IO unsupported.\n");
    return EXIT_SUCCESS;
#else
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(test_deserialize_portable_norun),
        cmocka_unit_test(test_deserialize_portable_wrun),
    };
    return cmocka_run_group_tests(tests, NULL, NULL);
#endif
}